

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufile_download.c
# Opt level: O2

ufile_error
download(char *bucket_name,char *key,size_t start_position,FILE *f,char *buf,size_t buf_len,
        size_t *return_size)

{
  uint uVar1;
  CURL *curl;
  size_t end_pos;
  undefined8 uVar2;
  ulong uVar3;
  char *pcVar4;
  ufile_error uVar5;
  FILE *local_98;
  char *local_90;
  size_t local_88;
  size_t sStack_80;
  char range [64];
  
  uVar5 = check_bucket_key(bucket_name,key);
  pcVar4 = uVar5.message;
  uVar1 = uVar5.code;
  uVar3 = (ulong)uVar1;
  if (uVar1 == 0 || uVar1 - 200 < 100) {
    curl = (CURL *)curl_easy_init();
    if (curl == (CURL *)0x0) {
      pcVar4 = "init curl failed.";
      uVar3 = 0xffffffffffffffec;
    }
    else {
      end_pos = (start_position - 1) + buf_len;
      if (buf_len == 0) {
        end_pos = 0;
      }
      uVar5 = set_download_options(curl,bucket_name,key,start_position,end_pos);
      pcVar4 = uVar5.message;
      uVar1 = uVar5.code;
      if (uVar1 - 200 < 100 || uVar1 == 0) {
        local_88 = 0;
        sStack_80 = 0;
        if (buf != (char *)0x0) {
          local_88 = buf_len;
        }
        uVar2 = 0;
        local_98 = f;
        local_90 = buf;
        curl_easy_setopt(curl,0x4e2b,http_write_cb);
        curl_easy_setopt(curl,0x2711,&local_98);
        if (end_pos != start_position) {
          range[0x30] = '\0';
          range[0x31] = '\0';
          range[0x32] = '\0';
          range[0x33] = '\0';
          range[0x34] = '\0';
          range[0x35] = '\0';
          range[0x36] = '\0';
          range[0x37] = '\0';
          range[0x38] = '\0';
          range[0x39] = '\0';
          range[0x3a] = '\0';
          range[0x3b] = '\0';
          range[0x3c] = '\0';
          range[0x3d] = '\0';
          range[0x3e] = '\0';
          range[0x3f] = '\0';
          range[0x20] = '\0';
          range[0x21] = '\0';
          range[0x22] = '\0';
          range[0x23] = '\0';
          range[0x24] = '\0';
          range[0x25] = '\0';
          range[0x26] = '\0';
          range[0x27] = '\0';
          range[0x28] = '\0';
          range[0x29] = '\0';
          range[0x2a] = '\0';
          range[0x2b] = '\0';
          range[0x2c] = '\0';
          range[0x2d] = '\0';
          range[0x2e] = '\0';
          range[0x2f] = '\0';
          range[0x10] = '\0';
          range[0x11] = '\0';
          range[0x12] = '\0';
          range[0x13] = '\0';
          range[0x14] = '\0';
          range[0x15] = '\0';
          range[0x16] = '\0';
          range[0x17] = '\0';
          range[0x18] = '\0';
          range[0x19] = '\0';
          range[0x1a] = '\0';
          range[0x1b] = '\0';
          range[0x1c] = '\0';
          range[0x1d] = '\0';
          range[0x1e] = '\0';
          range[0x1f] = '\0';
          range[0] = '\0';
          range[1] = '\0';
          range[2] = '\0';
          range[3] = '\0';
          range[4] = '\0';
          range[5] = '\0';
          range[6] = '\0';
          range[7] = '\0';
          range[8] = '\0';
          range[9] = '\0';
          range[10] = '\0';
          range[0xb] = '\0';
          range[0xc] = '\0';
          range[0xd] = '\0';
          range[0xe] = '\0';
          range[0xf] = '\0';
          sprintf(range,"Range: bytes=%ld-%ld",start_position,end_pos);
          uVar2 = curl_slist_append(0,range);
          curl_easy_setopt(curl,0x2727,uVar2);
        }
        uVar5 = curl_do(curl);
        pcVar4 = uVar5.message;
        uVar1 = uVar5.code;
        if (return_size != (size_t *)0x0) {
          *return_size = sStack_80;
        }
        if (end_pos != start_position) {
          curl_slist_free_all(uVar2);
        }
      }
      uVar3 = (ulong)uVar1;
      curl_easy_cleanup(curl);
    }
  }
  uVar5._0_8_ = uVar3 & 0xffffffff;
  uVar5.message = pcVar4;
  return uVar5;
}

Assistant:

static struct ufile_error
download(const char *bucket_name,
         const char *key,
         size_t start_position,
         FILE *f,
         char *buf,
         size_t buf_len,
         size_t *return_size)
{
    struct ufile_error error = NO_ERROR;
    error = check_bucket_key(bucket_name, key);
    if(UFILE_HAS_ERROR(error.code)){
        return error;
    }
    CURL *curl = curl_easy_init();
    if(curl == NULL){
        error.code = CURL_ERROR_CODE;
        error.message = CURL_INIT_ERROR_MSG;
        return error;
    }
    size_t start_pos=start_position;
    size_t end_pos=0;
    if(buf_len > 0){
        end_pos = start_position+buf_len-1;
    }

    error = set_download_options(curl, bucket_name, key, start_position, end_pos);
    if(UFILE_HAS_ERROR(error.code)){
        curl_easy_cleanup(curl);
        return error;
    }

    struct http_body body;
    memset(&body, 0, sizeof(struct http_body));
    body.buffer = buf;
    if(body.buffer != NULL){
        body.buffer_size = buf_len;
        body.pos_n = 0;
    }
    body.f = f;
    curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, http_write_cb);
    curl_easy_setopt(curl, CURLOPT_WRITEDATA, &body);

    struct curl_slist *header=NULL; 
    if((end_pos - start_pos) > 0){
        char range[64]={0};
        sprintf(range, "Range: bytes=%ld-%ld", start_pos, end_pos);
        header = curl_slist_append(header, range);
        curl_easy_setopt(curl, CURLOPT_HTTPHEADER, header);
    }

    error = curl_do(curl);
    if(return_size != NULL){
        *return_size = body.pos_n;
    }
    if((end_pos - start_pos) > 0){
        curl_slist_free_all(header);
    }
    curl_easy_cleanup(curl);
    return error;
}